

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcPlateType::~IfcPlateType(IfcPlateType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x83ee60;
  *(undefined8 *)&this->field_0x30 = 0x83ef78;
  *(undefined8 *)&this[-1].field_0xd0 = 0x83ee88;
  *(undefined8 *)&this[-1].field_0xe0 = 0x83eeb0;
  *(undefined8 *)&this[-1].field_0x138 = 0x83eed8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x83ef00;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x83ef28;
  *(undefined8 *)this = 0x83ef50;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x83f240;
  *(undefined8 *)&this->field_0x30 = 0x83f308;
  *(undefined8 *)&this[-1].field_0xd0 = 0x83f268;
  *(undefined8 *)&this[-1].field_0xe0 = 0x83f290;
  *(undefined8 *)&this[-1].field_0x138 = 0x83f2b8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x83f2e0;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>.field_0x20)
  {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__0083efa0);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcPlateType() : Object("IfcPlateType") {}